

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

mcmodef * mcmoal(mcmcx1def *ctx,mcmon *nump)

{
  ushort uVar1;
  mcmodef *pmVar2;
  mcmon mVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = ctx->mcmcxunu;
  while( true ) {
    if (uVar1 != 0xffff) {
      *nump = uVar1;
      pmVar2 = ctx->mcmcxtab[uVar1 >> 8];
      uVar6 = (ulong)((uVar1 & 0xff) << 5);
      ctx->mcmcxunu = *(mcmon *)((long)&pmVar2->mcmonxt + uVar6);
      *(undefined2 *)((long)&pmVar2->mcmoloc + uVar6) = 0xffff;
      return (mcmodef *)((long)&pmVar2->mcmoptr + uVar6);
    }
    uVar1 = ctx->mcmcxpage;
    if (uVar1 == ctx->mcmcxpgmx) break;
    ctx->mcmcxpage = uVar1 + 1;
    pmVar2 = (mcmodef *)mchalo(ctx->mcmcxerr,0x2000,"mcmoal");
    ctx->mcmcxtab[uVar1] = pmVar2;
    uVar4 = (uint)uVar1 << 8;
    mVar3 = (mcmon)uVar4;
    ctx->mcmcxunu = mVar3;
    pmVar2 = ctx->mcmcxtab[uVar1 & 0xff];
    uVar4 = uVar4 & 0xffff;
    if (uVar4 < (uVar4 | 0xff)) {
      iVar5 = 0;
      do {
        pmVar2->mcmonxt = mVar3 + 1 + (short)iVar5;
        pmVar2 = pmVar2 + 1;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0xff);
    }
    pmVar2->mcmonxt = 0xffff;
    uVar1 = ctx->mcmcxunu;
  }
  *nump = 0xffff;
  return (mcmodef *)0x0;
}

Assistant:

static mcmodef *mcmoal(mcmcx1def *ctx, mcmon *nump)
{
    mcmodef  *ret;
    uint      pagenum;
    
    MCMGLBCTX(ctx);
    
    /* look first in list of unused headers */
startover:
    if (ctx->mcmcxunu != MCMONINV)
    {
        /* we have something in the unused list; return it */
        *nump = ctx->mcmcxunu;
        ret = mcmgobje(ctx, *nump);
        ctx->mcmcxunu = ret->mcmonxt;
        ret->mcmoswh = MCSSEGINV;
        return(ret);
    }
    
    /*
     *   No unused entries: we must create a new page.  To do so, we
     *   simply allocate memory for a new page.  Allocate the memory
     *   ourselves, to avoid deadlocking with the allocator (which can
     *   try to get a new entry to satisfy our request for memory).
     */
    if (ctx->mcmcxpage == ctx->mcmcxpgmx) goto error;      /* no more pages */
    pagenum = ctx->mcmcxpage++;                      /* get a new page slot */
    
    ctx->mcmcxtab[pagenum] =
         (mcmodef *)mchalo(ctx->mcmcxerr, MCMPAGESIZE, "mcmoal");
    mcmadpg(ctx, pagenum, MCMONINV);
    goto startover;

error:
    *nump = MCMONINV;
    return((mcmodef *)0);
}